

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::IsConstructor(JavascriptProxy *instance)

{
  bool bVar1;
  int iVar2;
  RecyclableObject *obj;
  JavascriptFunction *pJVar3;
  
  do {
    obj = JavascriptProxy::GetTarget(instance);
    bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    if (!bVar1) break;
    instance = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
  } while (instance != (JavascriptProxy *)0x0);
  bVar1 = VarIsImpl<Js::JavascriptFunction>(obj);
  if ((bVar1) &&
     (pJVar3 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj),
     pJVar3 != (JavascriptFunction *)0x0)) {
    iVar2 = (*(pJVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])(pJVar3);
    return iVar2 != 0;
  }
  return false;
}

Assistant:

bool JavascriptOperators::IsConstructor(_In_ JavascriptProxy * instance)
    {
        // If it is a proxy, follow to the end of the proxy chain before checking if it is a constructor again.
        JavascriptProxy * proxy = instance;
        while (true)
        {
            RecyclableObject* targetInstance = proxy->GetTarget();
            proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(targetInstance);
            if (proxy == nullptr)
            {
                JavascriptFunction* function = JavascriptOperators::TryFromVar<JavascriptFunction>(targetInstance);
                return function && function->IsConstructor();
            }
        }
    }